

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateEmbeddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  EmbeddingLayerParams *pEVar2;
  WeightParams *bias;
  WeightParams *weights;
  allocator local_81;
  undefined1 local_80 [40];
  string local_58;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_80,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_80,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string((string *)&local_38,"Embedding",(allocator *)&local_58);
    validateInputOutputRankEquality((Result *)local_80,layer,&local_38,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_58,"Embedding",&local_81);
    validateRankCount((Result *)local_80,layer,&local_58,4,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_58);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pEVar2 = Specification::NeuralNetworkLayer::embedding(layer);
  weights = pEVar2->weights_;
  if (weights == (WeightParams *)0x0) {
    weights = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  bias = pEVar2->bias_;
  if (bias == (WeightParams *)0x0) {
    bias = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  validateEmbeddingWeightsBias((Result *)local_80,layer,weights,bias);
  Result::operator=(__return_storage_ptr__,(Result *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateEmbeddingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Embedding", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Embedding", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.embedding();
    r = validateEmbeddingWeightsBias(layer, params.weights(), params.bias());

    return r;
}